

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

void __thiscall
draco::OctahedronToolBox::CanonicalizeOctahedralCoords
          (OctahedronToolBox *this,int32_t s,int32_t t,int32_t *out_s,int32_t *out_t)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  iVar1 = this->max_value_;
  iVar3 = iVar1;
  iVar2 = iVar1;
  if (((t != 0 || s != 0) && (iVar3 = t, iVar2 = t, iVar1 != t || s != 0)) &&
     (iVar3 = s, iVar2 = s, iVar1 != s || t != 0)) {
    if ((s == 0) && (this->center_value_ < t)) {
      iVar3 = this->center_value_ * 2 - t;
      iVar2 = 0;
    }
    else if ((iVar1 == s) && (t < this->center_value_)) {
      iVar3 = this->center_value_ * 2 - t;
    }
    else {
      if ((iVar1 != t) || (iVar1 = this->center_value_, iVar1 <= s)) {
        iVar3 = t;
        if (t != 0) goto LAB_001436b6;
        iVar1 = this->center_value_;
        t = 0;
        iVar3 = t;
        if (s <= iVar1) goto LAB_001436b6;
      }
      iVar3 = t;
      iVar2 = iVar1 * 2 - s;
    }
  }
LAB_001436b6:
  *out_s = iVar2;
  *out_t = iVar3;
  return;
}

Assistant:

inline void CanonicalizeOctahedralCoords(int32_t s, int32_t t, int32_t *out_s,
                                           int32_t *out_t) const {
    if ((s == 0 && t == 0) || (s == 0 && t == max_value_) ||
        (s == max_value_ && t == 0)) {
      s = max_value_;
      t = max_value_;
    } else if (s == 0 && t > center_value_) {
      t = center_value_ - (t - center_value_);
    } else if (s == max_value_ && t < center_value_) {
      t = center_value_ + (center_value_ - t);
    } else if (t == max_value_ && s < center_value_) {
      s = center_value_ + (center_value_ - s);
    } else if (t == 0 && s > center_value_) {
      s = center_value_ - (s - center_value_);
    }

    *out_s = s;
    *out_t = t;
  }